

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall ColorPrimariesDisplayP3::ColorPrimariesDisplayP3(ColorPrimariesDisplayP3 *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_f2;
  allocator_type local_f1;
  _Vector_base<float,_std::allocator<float>_> local_f0;
  ColorPrimaryTransform local_d4;
  _Vector_base<float,_std::allocator<float>_> local_b0;
  float local_98 [12];
  float local_68 [11];
  ColorPrimaryTransform local_3c;
  
  local_68[4] = 0.69173855;
  local_68[5] = 0.07928691;
  local_68[6] = 0.0;
  local_68[7] = 0.04511338;
  local_68[0] = 0.48657095;
  local_68[1] = 0.2656677;
  local_68[2] = 0.19821729;
  local_68[3] = 0.22897457;
  local_68[8] = 1.0439441;
  __l._M_len = 9;
  __l._M_array = local_68;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f0,__l,&local_f1);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_d4,(vector<float,_std::allocator<float>_> *)&local_f0);
  local_98[4] = 1.7626641;
  local_98[5] = 0.023624687;
  local_98[6] = 0.03584583;
  local_98[7] = -0.07617239;
  local_98[0] = 2.493497;
  local_98[1] = -0.9313836;
  local_98[2] = -0.4027108;
  local_98[3] = -0.829489;
  local_98[8] = 0.9568845;
  __l_00._M_len = 9;
  __l_00._M_array = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b0,__l_00,&local_f2);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_3c,(vector<float,_std::allocator<float>_> *)&local_b0);
  (this->super_ColorPrimaries).toXYZ.matrix[2][2] = local_d4.matrix[2][2];
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[1] + 1) = local_d4.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[2] = local_d4.matrix[2]._0_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[0] = local_d4.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[0] + 2) = local_d4.matrix._8_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[0] = local_3c.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[0] + 2) = local_3c.matrix._8_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[1] + 1) = local_3c.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[2] = local_3c.matrix[2]._0_8_;
  (this->super_ColorPrimaries).fromXYZ.matrix[2][2] = local_3c.matrix[2][2];
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  return;
}

Assistant:

ColorPrimariesDisplayP3() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.4865709486f, +0.2656676932f, +0.1982172852f,
            +0.2289745641f, +0.6917385218f, +0.0792869141f,
             0.0000000000f, +0.0451133819f, +1.0439441689f
        }),
        ColorPrimaryTransform({
            +2.4934969119f, -0.9313836179f, -0.4027107845f,
            -0.8294889696f, +1.7626640603f, +0.0236246858f,
            +0.0358458302f, -0.0761723893f, +0.9568845240f
        })
    ) {}